

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O0

DistItemBaseSyntax * __thiscall slang::parsing::Parser::parseDistItem(Parser *this)

{
  Token extraOp;
  SourceRange range;
  Token extraOp_00;
  Token defaultKeyword_00;
  Token op_00;
  Token op_01;
  SourceRange range_00;
  SourceRange range_01;
  bool bVar1;
  Info *pIVar2;
  Diagnostic *pDVar3;
  long in_RDI;
  Token TVar4;
  basic_string_view<char,_std::char_traits<char>_> arg;
  SourceLocation loc;
  Token op2;
  Token op1;
  Token op;
  DistWeightSyntax *weight;
  ExpressionSyntax *elem;
  Token defaultKeyword;
  DistWeightSyntax *in_stack_fffffffffffffe48;
  Parser *in_stack_fffffffffffffe50;
  undefined6 in_stack_fffffffffffffe58;
  TokenKind in_stack_fffffffffffffe5e;
  SourceLocation in_stack_fffffffffffffe60;
  undefined6 in_stack_fffffffffffffe68;
  undefined1 in_stack_fffffffffffffe6e;
  undefined1 in_stack_fffffffffffffe6f;
  undefined1 uVar5;
  SourceLocation in_stack_fffffffffffffe70;
  SourceLocation in_stack_fffffffffffffe78;
  Diagnostic *in_stack_fffffffffffffe90;
  string_view in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffeb0;
  string_view in_stack_fffffffffffffeb8;
  undefined1 in_stack_ffffffffffffff30 [16];
  TokenKind local_c0;
  TokenKind local_b0;
  DistWeightSyntax *local_70;
  bitmask<slang::parsing::detail::ExpressionOptions> local_64;
  string_view local_60;
  SourceRange local_50;
  undefined4 local_3c;
  Token local_38;
  ExpressionSyntax *local_28;
  Token local_20;
  DefaultDistItemSyntax *local_8;
  
  Token::Token((Token *)in_stack_fffffffffffffe50);
  local_28 = (ExpressionSyntax *)0x0;
  bVar1 = ParserBase::peek((ParserBase *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe5e);
  if (bVar1) {
    TVar4 = ParserBase::consume((ParserBase *)in_stack_fffffffffffffe70);
    local_38._0_8_ = TVar4._0_8_;
    local_20.kind = local_38.kind;
    local_20._2_1_ = local_38._2_1_;
    local_20.numFlags.raw = local_38.numFlags.raw;
    local_20.rawLen = local_38.rawLen;
    local_38.info = TVar4.info;
    local_20.info = local_38.info;
    local_38 = TVar4;
    if (*(int *)(in_RDI + 0xf4) < 1) {
      local_3c = 0x20001;
      local_50 = Token::range((Token *)in_stack_fffffffffffffe70);
      range_00.endLoc = in_stack_fffffffffffffe78;
      range_00.startLoc = in_stack_fffffffffffffe70;
      in_stack_fffffffffffffe78 =
           (SourceLocation)
           ParserBase::addDiag((ParserBase *)
                               CONCAT17(in_stack_fffffffffffffe6f,
                                        CONCAT16(in_stack_fffffffffffffe6e,in_stack_fffffffffffffe68
                                                )),SUB84((ulong)in_RDI >> 0x20,0),range_00);
      local_60 = slang::toString(Default);
      Diagnostic::operator<<(in_stack_fffffffffffffe90,in_stack_fffffffffffffe98);
    }
  }
  else {
    memset(&local_64,0,4);
    bitmask<slang::parsing::detail::ExpressionOptions>::bitmask(&local_64);
    local_28 = parseValueRangeElement
                         (in_stack_ffffffffffffff30._0_8_,
                          (bitmask<slang::parsing::detail::ExpressionOptions>)
                          in_stack_ffffffffffffff30._12_4_);
  }
  local_70 = (DistWeightSyntax *)0x0;
  bVar1 = ParserBase::peek((ParserBase *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe5e);
  if ((bVar1) ||
     (bVar1 = ParserBase::peek((ParserBase *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe5e),
     bVar1)) {
    ParserBase::consume((ParserBase *)in_stack_fffffffffffffe70);
    pIVar2 = (Info *)(in_RDI + 0xe0);
    Token::Token((Token *)in_stack_fffffffffffffe50);
    parseExpression(in_stack_fffffffffffffe50);
    op_00.rawLen._2_1_ = in_stack_fffffffffffffe6e;
    op_00._0_6_ = in_stack_fffffffffffffe68;
    op_00.rawLen._3_1_ = in_stack_fffffffffffffe6f;
    op_00.info = pIVar2;
    extraOp.rawLen._2_2_ = in_stack_fffffffffffffe5e;
    extraOp._0_6_ = in_stack_fffffffffffffe58;
    extraOp.info = (Info *)in_stack_fffffffffffffe60;
    local_70 = slang::syntax::SyntaxFactory::distWeight
                         ((SyntaxFactory *)in_stack_fffffffffffffe50,op_00,extraOp,
                          (ExpressionSyntax *)in_stack_fffffffffffffe48);
  }
  else {
    bVar1 = ParserBase::peek((ParserBase *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe5e);
    uVar5 = false;
    if (bVar1) {
      TVar4 = ParserBase::peek((ParserBase *)
                               CONCAT26(in_stack_fffffffffffffe5e,in_stack_fffffffffffffe58),
                               (uint32_t)((ulong)in_stack_fffffffffffffe50 >> 0x20));
      local_b0 = TVar4.kind;
      in_stack_fffffffffffffe6e = true;
      uVar5 = in_stack_fffffffffffffe6e;
      if (local_b0 != Equals) {
        TVar4 = ParserBase::peek((ParserBase *)
                                 CONCAT26(in_stack_fffffffffffffe5e,in_stack_fffffffffffffe58),
                                 (uint32_t)((ulong)in_stack_fffffffffffffe50 >> 0x20));
        local_c0 = TVar4.kind;
        in_stack_fffffffffffffe6e = local_c0 == Slash;
        uVar5 = in_stack_fffffffffffffe6e;
      }
    }
    if ((bool)uVar5 != false) {
      ParserBase::consume((ParserBase *)in_stack_fffffffffffffe70);
      ParserBase::consume((ParserBase *)in_stack_fffffffffffffe70);
      Token::range((Token *)in_stack_fffffffffffffe70);
      range_01.endLoc = in_stack_fffffffffffffe78;
      range_01.startLoc = in_stack_fffffffffffffe70;
      pDVar3 = ParserBase::addDiag((ParserBase *)
                                   CONCAT17(uVar5,CONCAT16(in_stack_fffffffffffffe6e,
                                                           in_stack_fffffffffffffe68)),
                                   SUB84((ulong)in_RDI >> 0x20,0),range_01);
      in_stack_fffffffffffffe58 = SUB86(pDVar3,0);
      in_stack_fffffffffffffe5e = (TokenKind)((ulong)pDVar3 >> 0x30);
      Token::range((Token *)in_stack_fffffffffffffe70);
      range.startLoc._6_2_ = in_stack_fffffffffffffe5e;
      range.startLoc._0_6_ = in_stack_fffffffffffffe58;
      range.endLoc = in_stack_fffffffffffffe60;
      Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffe50,range);
      in_stack_fffffffffffffe60 = (SourceLocation)(in_RDI + 0xe0);
      parseExpression(in_stack_fffffffffffffe50);
      op_01.rawLen._2_1_ = in_stack_fffffffffffffe6e;
      op_01._0_6_ = in_stack_fffffffffffffe68;
      op_01.rawLen._3_1_ = uVar5;
      op_01.info = (Info *)in_stack_fffffffffffffe70;
      extraOp_00.rawLen._2_2_ = in_stack_fffffffffffffe5e;
      extraOp_00._0_6_ = in_stack_fffffffffffffe58;
      extraOp_00.info = (Info *)in_stack_fffffffffffffe60;
      local_70 = slang::syntax::SyntaxFactory::distWeight
                           ((SyntaxFactory *)in_stack_fffffffffffffe50,op_01,extraOp_00,
                            (ExpressionSyntax *)in_stack_fffffffffffffe48);
    }
  }
  if (local_28 == (ExpressionSyntax *)0x0) {
    if ((local_70 == (DistWeightSyntax *)0x0) ||
       (((local_70->op).kind != ColonSlash && ((local_70->extraOp).kind != Slash)))) {
      if (local_70 == (DistWeightSyntax *)0x0) {
        Token::location(&local_20);
        in_stack_fffffffffffffeb8 = Token::rawText((Token *)in_stack_fffffffffffffe60);
        std::basic_string_view<char,_std::char_traits<char>_>::length
                  ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xfffffffffffffeb8);
        SourceLocation::operator+<unsigned_long>
                  ((SourceLocation *)CONCAT26(in_stack_fffffffffffffe5e,in_stack_fffffffffffffe58),
                   (unsigned_long)in_stack_fffffffffffffe50);
      }
      else {
        Token::location(&local_70->op);
      }
      in_stack_fffffffffffffe50 =
           (Parser *)
           ParserBase::addDiag((ParserBase *)CONCAT44(0x550005,in_stack_fffffffffffffeb0),
                               in_stack_fffffffffffffeb8._M_str._4_4_,
                               (SourceLocation)in_stack_fffffffffffffeb8._M_len);
      arg = sv((char *)in_stack_fffffffffffffe50,(size_t)in_stack_fffffffffffffe48);
      Diagnostic::operator<<(in_stack_fffffffffffffe90,arg);
    }
    defaultKeyword_00.rawLen._2_2_ = in_stack_fffffffffffffe5e;
    defaultKeyword_00._0_6_ = in_stack_fffffffffffffe58;
    defaultKeyword_00.info = (Info *)in_stack_fffffffffffffe60;
    local_8 = slang::syntax::SyntaxFactory::defaultDistItem
                        ((SyntaxFactory *)in_stack_fffffffffffffe50,defaultKeyword_00,
                         in_stack_fffffffffffffe48);
  }
  else {
    local_8 = (DefaultDistItemSyntax *)
              slang::syntax::SyntaxFactory::distItem
                        ((SyntaxFactory *)in_stack_fffffffffffffe50,
                         (ExpressionSyntax *)in_stack_fffffffffffffe48,(DistWeightSyntax *)0x8b1c42)
    ;
  }
  return &local_8->super_DistItemBaseSyntax;
}

Assistant:

DistItemBaseSyntax& Parser::parseDistItem() {
    Token defaultKeyword;
    ExpressionSyntax* elem = nullptr;
    if (peek(TokenKind::DefaultKeyword)) {
        defaultKeyword = consume();
        if (parseOptions.languageVersion < LanguageVersion::v1800_2023) {
            addDiag(diag::WrongLanguageVersion, defaultKeyword.range())
                << toString(parseOptions.languageVersion);
        }
    }
    else {
        elem = &parseValueRangeElement();
    }

    DistWeightSyntax* weight = nullptr;
    if (peek(TokenKind::ColonEquals) || peek(TokenKind::ColonSlash)) {
        auto op = consume();
        weight = &factory.distWeight(op, Token(), parseExpression());
    }
    else if (peek(TokenKind::Colon) &&
             (peek(1).kind == TokenKind::Equals || peek(1).kind == TokenKind::Slash)) {
        // VCS allows the dist weight operators to be split, so allow this with a diagnostic
        // for compat purposes.
        auto op1 = consume();
        auto op2 = consume();
        addDiag(diag::SplitDistWeightOp, op1.range()) << op2.range();
        weight = &factory.distWeight(op1, op2, parseExpression());
    }

    if (elem)
        return factory.distItem(*elem, weight);

    if (!weight ||
        (weight->op.kind != TokenKind::ColonSlash && weight->extraOp.kind != TokenKind::Slash)) {
        auto loc = weight ? weight->op.location()
                          : defaultKeyword.location() + defaultKeyword.rawText().length();
        addDiag(diag::ExpectedToken, loc) << ":/"sv;
    }

    return factory.defaultDistItem(defaultKeyword, weight);
}